

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::init_frame(jpeg_decoder *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint8 *puVar4;
  void *pvVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar13;
  
  if (this->m_comps_in_frame == 3) {
    if ((((this->m_comp_h_samp[1] != 1) || (this->m_comp_v_samp[1] != 1)) ||
        (this->m_comp_h_samp[2] != 1)) || (this->m_comp_v_samp[2] != 1)) goto LAB_00152977;
    uVar8 = this->m_comp_h_samp[0];
    uVar1 = this->m_comp_v_samp[0];
    iVar3 = 8;
    if ((uVar8 ^ 1) == 0 && (uVar1 ^ 1) == 0) {
      iVar9 = 4;
      iVar11 = 3;
      iVar16 = 1;
      iVar7 = 8;
    }
    else {
      iVar11 = 4;
      if (uVar8 == 2 && (uVar1 ^ 1) == 0) {
        iVar7 = 0x10;
        iVar16 = 2;
      }
      else if ((uVar8 ^ 1) == 0 && uVar1 == 2) {
        iVar3 = 0x10;
        iVar16 = 3;
        iVar7 = 8;
      }
      else {
        if ((uVar8 != 2) || (uVar1 != 2)) goto LAB_00152977;
        iVar7 = 0x10;
        iVar11 = 6;
        iVar16 = 4;
        iVar3 = 0x10;
      }
      iVar9 = 4;
    }
  }
  else {
    if (this->m_comps_in_frame != 1) {
      stop_decoding(this,JPGD_UNSUPPORTED_COLORSPACE);
    }
    if ((this->m_comp_h_samp[0] != 1) || (this->m_comp_v_samp[0] != 1)) {
LAB_00152977:
      stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
    }
    iVar16 = 0;
    iVar7 = 8;
    iVar11 = 1;
    iVar3 = 8;
    iVar9 = 1;
  }
  this->m_scan_type = iVar16;
  this->m_max_blocks_per_mcu = iVar11;
  this->m_max_mcu_x_size = iVar7;
  this->m_max_mcu_y_size = iVar3;
  iVar11 = this->m_image_x_size;
  this->m_max_mcus_per_row = (iVar11 + iVar7 + -1) / iVar7;
  this->m_max_mcus_per_col = (this->m_image_y_size + iVar3 + -1) / iVar3;
  this->m_dest_bytes_per_pixel = iVar9;
  uVar8 = (iVar11 + 0xfU & 0xfff0) * iVar9;
  this->m_dest_bytes_per_scan_line = uVar8;
  this->m_real_dest_bytes_per_scan_line = iVar9 * iVar11;
  puVar4 = (uint8 *)alloc(this,(ulong)uVar8,false);
  this->m_pScan_line_0 = puVar4;
  if (this->m_scan_type - 3U < 2) {
    puVar4 = (uint8 *)alloc(this,(long)this->m_dest_bytes_per_scan_line,false);
    this->m_pScan_line_1 = puVar4;
  }
  iVar3 = this->m_max_mcus_per_row * this->m_max_blocks_per_mcu;
  this->m_max_blocks_per_row = iVar3;
  if (0x4000 < iVar3) {
    stop_decoding(this,JPGD_DECODE_ERROR);
  }
  pvVar5 = alloc(this,(long)this->m_max_blocks_per_mcu << 7 | 0xf,false);
  this->m_pMCU_coefficients = (jpgd_block_coeff_t *)((long)pvVar5 + 0xfU & 0xfffffffffffffff0);
  auVar2 = _DAT_001a7020;
  iVar3 = this->m_max_blocks_per_mcu;
  if (0 < (long)iVar3) {
    lVar6 = (long)iVar3 + -1;
    auVar10._8_4_ = (int)lVar6;
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar10 = auVar10 ^ _DAT_001a7020;
    auVar12 = _DAT_001a70c0;
    auVar14 = _DAT_001a7010;
    do {
      auVar15 = auVar14 ^ auVar2;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar11 && auVar10._0_4_ < auVar15._0_4_ ||
                  iVar11 < auVar15._4_4_) & 1)) {
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar6) = 0x40;
      }
      if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
          auVar15._12_4_ <= auVar10._12_4_) {
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar6 + 4) = 0x40;
      }
      auVar15 = auVar12 ^ auVar2;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar11 && (iVar16 != iVar11 || auVar15._0_4_ <= auVar10._0_4_)) {
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar6 + 8) = 0x40;
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar6 + 0xc) = 0x40;
      }
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar13 + 4;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar13 + 4;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(iVar3 + 3U >> 2) << 4 != lVar6);
  }
  pvVar5 = alloc(this,(long)this->m_max_blocks_per_row << 6 | 0xf,false);
  this->m_pSample_buf = (uint8 *)((long)pvVar5 + 0xfU & 0xfffffffffffffff0);
  pvVar5 = alloc(this,(long)this->m_max_blocks_per_row << 6 | 0xf,false);
  this->m_pSample_buf_prev = (uint8 *)((long)pvVar5 + 0xfU & 0xfffffffffffffff0);
  this->m_total_lines_left = this->m_image_y_size;
  this->m_mcu_lines_left = 0;
  create_look_ups(this);
  return;
}

Assistant:

void jpeg_decoder::init_frame()
	{
		int i;

		if (m_comps_in_frame == 1)
		{
			if ((m_comp_h_samp[0] != 1) || (m_comp_v_samp[0] != 1))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			m_scan_type = JPGD_GRAYSCALE;
			m_max_blocks_per_mcu = 1;
			m_max_mcu_x_size = 8;
			m_max_mcu_y_size = 8;
		}
		else if (m_comps_in_frame == 3)
		{
			if (((m_comp_h_samp[1] != 1) || (m_comp_v_samp[1] != 1)) ||
				((m_comp_h_samp[2] != 1) || (m_comp_v_samp[2] != 1)))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1))
			{
				m_scan_type = JPGD_YH1V1;

				m_max_blocks_per_mcu = 3;
				m_max_mcu_x_size = 8;
				m_max_mcu_y_size = 8;
			}
			else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1))
			{
				m_scan_type = JPGD_YH2V1;
				m_max_blocks_per_mcu = 4;
				m_max_mcu_x_size = 16;
				m_max_mcu_y_size = 8;
			}
			else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 2))
			{
				m_scan_type = JPGD_YH1V2;
				m_max_blocks_per_mcu = 4;
				m_max_mcu_x_size = 8;
				m_max_mcu_y_size = 16;
			}
			else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2))
			{
				m_scan_type = JPGD_YH2V2;
				m_max_blocks_per_mcu = 6;
				m_max_mcu_x_size = 16;
				m_max_mcu_y_size = 16;
			}
			else
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);
		}
		else
			stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

		m_max_mcus_per_row = (m_image_x_size + (m_max_mcu_x_size - 1)) / m_max_mcu_x_size;
		m_max_mcus_per_col = (m_image_y_size + (m_max_mcu_y_size - 1)) / m_max_mcu_y_size;

		// These values are for the *destination* pixels: after conversion.
		if (m_scan_type == JPGD_GRAYSCALE)
			m_dest_bytes_per_pixel = 1;
		else
			m_dest_bytes_per_pixel = 4;

		m_dest_bytes_per_scan_line = ((m_image_x_size + 15) & 0xFFF0) * m_dest_bytes_per_pixel;

		m_real_dest_bytes_per_scan_line = (m_image_x_size * m_dest_bytes_per_pixel);

		// Initialize two scan line buffers.
		m_pScan_line_0 = (uint8*)alloc_aligned(m_dest_bytes_per_scan_line, true);
		if ((m_scan_type == JPGD_YH1V2) || (m_scan_type == JPGD_YH2V2))
			m_pScan_line_1 = (uint8*)alloc_aligned(m_dest_bytes_per_scan_line, true);

		m_max_blocks_per_row = m_max_mcus_per_row * m_max_blocks_per_mcu;

		// Should never happen
		if (m_max_blocks_per_row > JPGD_MAX_BLOCKS_PER_ROW)
			stop_decoding(JPGD_DECODE_ERROR);

		// Allocate the coefficient buffer, enough for one MCU
		m_pMCU_coefficients = (jpgd_block_coeff_t *)alloc_aligned(m_max_blocks_per_mcu * 64 * sizeof(jpgd_block_coeff_t));
				
		for (i = 0; i < m_max_blocks_per_mcu; i++)
			m_mcu_block_max_zag[i] = 64;

		m_pSample_buf = (uint8*)alloc_aligned(m_max_blocks_per_row * 64);
		m_pSample_buf_prev = (uint8*)alloc_aligned(m_max_blocks_per_row * 64);

		m_total_lines_left = m_image_y_size;

		m_mcu_lines_left = 0;

		create_look_ups();
	}